

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

uchar * stbi__convert_format(uchar *data,int img_n,int req_comp,uint x,uint y)

{
  byte bVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  uchar *in_RDI;
  int in_R8D;
  char (*unaff_retaddr) [31];
  uchar *dest;
  uchar *src;
  uchar *good;
  int j;
  int i;
  undefined8 in_stack_ffffffffffffffb8;
  byte *local_40;
  byte *local_38;
  int local_28;
  int local_24;
  uchar *local_8;
  
  local_8 = in_RDI;
  if (in_EDX != in_ESI) {
    if ((in_EDX < 1) || (4 < in_EDX)) {
      pbrt::LogFatal<char_const(&)[31]>(i,(char *)good,src._4_4_,(char *)dest,unaff_retaddr);
    }
    local_8 = (uchar *)stbi__malloc_mad3((int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                                         (int)in_stack_ffffffffffffffb8,0,0x92d2c8);
    if (local_8 == (uchar *)0x0) {
      free(in_RDI);
      stbi__err("outofmem");
      local_8 = (uchar *)0x0;
    }
    else {
      for (local_28 = 0; local_28 < in_R8D; local_28 = local_28 + 1) {
        local_38 = in_RDI + (uint)(local_28 * in_ECX * in_ESI);
        local_40 = local_8 + (uint)(local_28 * in_ECX * in_EDX);
        switch(in_EDX + -10 + in_ESI * 8) {
        case 0:
          for (local_24 = in_ECX + -1; -1 < local_24; local_24 = local_24 + -1) {
            *local_40 = *local_38;
            local_40[1] = 0xff;
            local_38 = local_38 + 1;
            local_40 = local_40 + 2;
          }
          break;
        case 1:
          for (local_24 = in_ECX + -1; -1 < local_24; local_24 = local_24 + -1) {
            bVar1 = *local_38;
            local_40[2] = bVar1;
            local_40[1] = bVar1;
            *local_40 = bVar1;
            local_38 = local_38 + 1;
            local_40 = local_40 + 3;
          }
          break;
        case 2:
          for (local_24 = in_ECX + -1; -1 < local_24; local_24 = local_24 + -1) {
            bVar1 = *local_38;
            local_40[2] = bVar1;
            local_40[1] = bVar1;
            *local_40 = bVar1;
            local_40[3] = 0xff;
            local_38 = local_38 + 1;
            local_40 = local_40 + 4;
          }
          break;
        default:
          pbrt::LogFatal<char_const(&)[2]>
                    (i,(char *)good,src._4_4_,(char *)dest,(char (*) [2])unaff_retaddr);
        case 7:
          for (local_24 = in_ECX + -1; -1 < local_24; local_24 = local_24 + -1) {
            *local_40 = *local_38;
            local_38 = local_38 + 2;
            local_40 = local_40 + 1;
          }
          break;
        case 9:
          for (local_24 = in_ECX + -1; -1 < local_24; local_24 = local_24 + -1) {
            bVar1 = *local_38;
            local_40[2] = bVar1;
            local_40[1] = bVar1;
            *local_40 = bVar1;
            local_38 = local_38 + 2;
            local_40 = local_40 + 3;
          }
          break;
        case 10:
          for (local_24 = in_ECX + -1; -1 < local_24; local_24 = local_24 + -1) {
            bVar1 = *local_38;
            local_40[2] = bVar1;
            local_40[1] = bVar1;
            *local_40 = bVar1;
            local_40[3] = local_38[1];
            local_38 = local_38 + 2;
            local_40 = local_40 + 4;
          }
          break;
        case 0xf:
          for (local_24 = in_ECX + -1; -1 < local_24; local_24 = local_24 + -1) {
            bVar1 = stbi__compute_y((uint)*local_38,(uint)local_38[1],(uint)local_38[2]);
            *local_40 = bVar1;
            local_38 = local_38 + 3;
            local_40 = local_40 + 1;
          }
          break;
        case 0x10:
          for (local_24 = in_ECX + -1; -1 < local_24; local_24 = local_24 + -1) {
            bVar1 = stbi__compute_y((uint)*local_38,(uint)local_38[1],(uint)local_38[2]);
            *local_40 = bVar1;
            local_40[1] = 0xff;
            local_38 = local_38 + 3;
            local_40 = local_40 + 2;
          }
          break;
        case 0x12:
          for (local_24 = in_ECX + -1; -1 < local_24; local_24 = local_24 + -1) {
            *local_40 = *local_38;
            local_40[1] = local_38[1];
            local_40[2] = local_38[2];
            local_40[3] = 0xff;
            local_38 = local_38 + 3;
            local_40 = local_40 + 4;
          }
          break;
        case 0x17:
          for (local_24 = in_ECX + -1; -1 < local_24; local_24 = local_24 + -1) {
            bVar1 = stbi__compute_y((uint)*local_38,(uint)local_38[1],(uint)local_38[2]);
            *local_40 = bVar1;
            local_38 = local_38 + 4;
            local_40 = local_40 + 1;
          }
          break;
        case 0x18:
          for (local_24 = in_ECX + -1; -1 < local_24; local_24 = local_24 + -1) {
            bVar1 = stbi__compute_y((uint)*local_38,(uint)local_38[1],(uint)local_38[2]);
            *local_40 = bVar1;
            local_40[1] = local_38[3];
            local_38 = local_38 + 4;
            local_40 = local_40 + 2;
          }
          break;
        case 0x19:
          for (local_24 = in_ECX + -1; -1 < local_24; local_24 = local_24 + -1) {
            *local_40 = *local_38;
            local_40[1] = local_38[1];
            local_40[2] = local_38[2];
            local_38 = local_38 + 4;
            local_40 = local_40 + 3;
          }
        }
      }
      free(in_RDI);
    }
  }
  return local_8;
}

Assistant:

static unsigned char *stbi__convert_format(unsigned char *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   unsigned char *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (unsigned char *) stbi__malloc_mad3(req_comp, x, y, 0);
   if (good == NULL) {
      STBI_FREE(data);
      return stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      unsigned char *src  = data + j * x * img_n   ;
      unsigned char *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=255;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=255;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                  } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                  } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=255;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = 255;    } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                    } break;
         default: STBI_ASSERT(0); STBI_FREE(data); STBI_FREE(good); return stbi__errpuc("unsupported", "Unsupported format conversion");
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}